

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcastu.c
# Opt level: O0

int castmu(monst *mtmp,attack *mattk,boolean thinks_it_foundyou,boolean foundyou)

{
  boolean bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  obj *poVar5;
  int iVar6;
  char *pcVar7;
  bool bVar8;
  uint local_7c;
  uint local_78;
  char *local_70;
  char *local_68;
  char *local_58;
  char *local_50;
  int local_38;
  int local_34;
  int cnt;
  int spellnum;
  int ret;
  int ml;
  int dmg;
  boolean foundyou_local;
  boolean thinks_it_foundyou_local;
  attack *mattk_local;
  monst *mtmp_local;
  
  local_7c = (uint)mtmp->m_lev;
  local_34 = 0;
  if (((mattk->adtyp == 0xf1) || (mattk->adtyp == 0xf0)) && (local_7c != 0)) {
    local_38 = 0x28;
    do {
      iVar3 = rn2(local_7c);
      if (mattk->adtyp == 0xf1) {
        local_34 = choose_magic_spell(iVar3);
      }
      else {
        local_34 = choose_clerical_spell(iVar3);
      }
      if (thinks_it_foundyou == '\0') {
        bVar1 = is_undirected_spell((uint)mattk->adtyp,local_34);
        if ((bVar1 == '\0') ||
           (bVar1 = spell_would_be_useless(mtmp,(uint)mattk->adtyp,local_34), bVar1 != '\0')) {
          if (foundyou != '\0') {
            warning("spellcasting monster found you and doesn\'t know it?");
          }
          return 0;
        }
        break;
      }
      local_38 = local_38 + -1;
      bVar8 = false;
      if (0 < local_38) {
        bVar1 = spell_would_be_useless(mtmp,(uint)mattk->adtyp,local_34);
        bVar8 = bVar1 != '\0';
      }
    } while (bVar8);
    if (local_38 == 0) {
      return 0;
    }
  }
  if ((((*(uint *)&mtmp->field_0x60 >> 8 & 1) != 0) || (mtmp->mspec_used != 0)) || (local_7c == 0))
  {
    bVar1 = is_undirected_spell((uint)mattk->adtyp,local_34);
    cursetxt(mtmp,bVar1);
    return 0;
  }
  if ((mattk->adtyp == 0xf1) || (mattk->adtyp == 0xf0)) {
    mtmp->mspec_used = 10 - (uint)mtmp->m_lev;
    if (mtmp->mspec_used < 2) {
      mtmp->mspec_used = 2;
    }
    if (mtmp->data->msound == '\x1f') {
      mtmp->mspec_used = 0;
    }
  }
  if (((foundyou == '\0') && (thinks_it_foundyou != '\0')) &&
     (bVar1 = is_undirected_spell((uint)mattk->adtyp,local_34), bVar1 == '\0')) {
    if (mtmp->wormno == '\0') {
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_0020fed4;
      if ((((((u.uprops[0x1e].intrinsic == 0) &&
             ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
            (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
           ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
          ((u.uprops[0x40].intrinsic != 0 ||
           ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))))) &&
         ((mtmp->data->mflags3 & 0x200) != 0)) {
        bVar2 = viz_array[mtmp->my][mtmp->mx] & 1;
        goto joined_r0x0020fece;
      }
    }
    else {
      bVar2 = worm_known(level,mtmp);
joined_r0x0020fece:
      if (bVar2 != 0) {
LAB_0020fed4:
        if ((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
             (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
           ((((*(uint *)&mtmp->field_0x60 >> 7 & 1) == 0 &&
             ((*(uint *)&mtmp->field_0x60 >> 9 & 1) == 0)) && (((byte)u._1052_1_ >> 5 & 1) == 0))))
        {
          local_50 = Monnam(mtmp);
          goto LAB_0020ff79;
        }
      }
    }
    local_50 = "Something";
LAB_0020ff79:
    pcVar7 = "thin air";
    if (level->locations[mtmp->mux][mtmp->muy].typ == '\x13') {
      pcVar7 = "empty water";
    }
    pline("%s casts a spell at %s!",local_50,pcVar7);
    return 0;
  }
  nomul(0,(char *)0x0);
  iVar3 = rn2(local_7c * 10);
  iVar6 = 0x14;
  if ((*(uint *)&mtmp->field_0x60 >> 0x15 & 1) != 0) {
    iVar6 = 100;
  }
  if (iVar3 < iVar6) {
    if (mtmp->wormno == '\0') {
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_00210176;
      if (((u.uprops[0x1e].intrinsic != 0) || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed))))
         || (((youmonst.data)->mflags1 & 0x1000) != 0)) {
        if (ublindf == (obj *)0x0) {
          return 0;
        }
        if (ublindf->oartifact != '\x1d') {
          return 0;
        }
      }
      if (((u.uprops[0x40].intrinsic == 0) && (u.uprops[0x40].extrinsic == 0)) &&
         (((youmonst.data)->mflags3 & 0x100) == 0)) {
        return 0;
      }
      if ((mtmp->data->mflags3 & 0x200) == 0) {
        return 0;
      }
      bVar2 = viz_array[mtmp->my][mtmp->mx] & 1;
    }
    else {
      bVar2 = worm_known(level,mtmp);
    }
    if (bVar2 == 0) {
      return 0;
    }
LAB_00210176:
    if ((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
         ((u.uprops[0xc].extrinsic != 0 || (((youmonst.data)->mflags1 & 0x1000000) != 0)))) &&
        (((*(uint *)&mtmp->field_0x60 >> 7 & 1) == 0 && ((*(uint *)&mtmp->field_0x60 >> 9 & 1) == 0)
         ))) && ((((byte)u._1052_1_ >> 5 & 1) == 0 && (flags.soundok != '\0')))) {
      pcVar7 = mon_nam(mtmp);
      pline("The air crackles around %s.",pcVar7);
    }
    return 0;
  }
  if (mtmp->wormno == '\0') {
    if (((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) ||
       ((((u.uprops[0x1e].intrinsic == 0 &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
        (((u.uprops[0x40].intrinsic != 0 ||
          ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
         (((mtmp->data->mflags3 & 0x200) != 0 && ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0))))))))
    goto LAB_00210391;
LAB_0021041e:
    if (((((mtmp->data->mflags1 & 0x10000) != 0) ||
         ((poVar5 = which_armor(mtmp,4), poVar5 != (obj *)0x0 &&
          (poVar5 = which_armor(mtmp,4), poVar5->otyp == 0x4f)))) ||
        (((((u.uprops[0x1e].intrinsic == 0 &&
            (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
             (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
           (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
            ((((u.uprops[0x19].intrinsic == 0 &&
               ((u.uprops[0x19].extrinsic == 0 && (youmonst.data != mons + 0x1e)))) &&
              (youmonst.data != mons + 0x31)) && (youmonst.data != mons + 0x32)))))) ||
          (u.uprops[0x19].blocked != 0)) &&
         (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
          (iVar3 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), 0x40 < iVar3)))))) &&
       (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
        ((bVar1 = match_warn_of_mon(mtmp), bVar1 == '\0' &&
         (bVar1 = is_undirected_spell((uint)mattk->adtyp,local_34), bVar1 != '\0'))))))
    goto LAB_00210b75;
  }
  else {
    bVar1 = worm_known(level,mtmp);
    if (bVar1 == '\0') goto LAB_0021041e;
LAB_00210391:
    if ((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
         (u.uprops[0xc].extrinsic == 0)) && (((youmonst.data)->mflags1 & 0x1000000) == 0)) ||
       ((((*(uint *)&mtmp->field_0x60 >> 7 & 1) != 0 || ((*(uint *)&mtmp->field_0x60 >> 9 & 1) != 0)
         ) || (((byte)u._1052_1_ >> 5 & 1) != 0)))) goto LAB_0021041e;
  }
  if (mtmp->wormno == '\0') {
    if (((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) ||
       (((((u.uprops[0x1e].intrinsic == 0 && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
          && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
        ((((u.uprops[0x40].intrinsic != 0 ||
           ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
          ((mtmp->data->mflags3 & 0x200) != 0)) && ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0))))))
    goto LAB_00210755;
LAB_002107e2:
    if (((((mtmp->data->mflags1 & 0x10000) == 0) &&
         ((poVar5 = which_armor(mtmp,4), poVar5 == (obj *)0x0 ||
          (poVar5 = which_armor(mtmp,4), poVar5->otyp != 0x4f)))) &&
        (((((u.uprops[0x1e].intrinsic != 0 ||
            (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
             (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
           (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
            (((u.uprops[0x19].intrinsic != 0 ||
              ((u.uprops[0x19].extrinsic != 0 || (youmonst.data == mons + 0x1e)))) ||
             ((youmonst.data == mons + 0x31 || (youmonst.data == mons + 0x32)))))))) &&
          (u.uprops[0x19].blocked == 0)) ||
         (((u.uprops[0x19].extrinsic != 0 && (u.uprops[0x19].blocked == 0)) &&
          (iVar3 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar3 < 0x41)))))) ||
       (((u.uprops[0x42].intrinsic != 0 || (u.uprops[0x42].extrinsic != 0)) ||
        (bVar1 = match_warn_of_mon(mtmp), bVar1 != '\0')))) goto LAB_002109a5;
    local_58 = "Something";
  }
  else {
    bVar1 = worm_known(level,mtmp);
    if (bVar1 == '\0') goto LAB_002107e2;
LAB_00210755:
    if (((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
          (u.uprops[0xc].extrinsic == 0)) && (((youmonst.data)->mflags1 & 0x1000000) == 0)) ||
        (((*(uint *)&mtmp->field_0x60 >> 7 & 1) != 0 || ((*(uint *)&mtmp->field_0x60 >> 9 & 1) != 0)
         ))) || (((byte)u._1052_1_ >> 5 & 1) != 0)) goto LAB_002107e2;
LAB_002109a5:
    local_58 = Monnam(mtmp);
  }
  bVar1 = is_undirected_spell((uint)mattk->adtyp,local_34);
  if (bVar1 == '\0') {
    if ((((u.uprops[0xd].intrinsic == 0) && (u.uprops[0xd].extrinsic == 0)) &&
        ((youmonst.data != mons + 0x9e && (youmonst.data != mons + 0x7b)))) ||
       (((((u.uprops[0xd].blocked != 0 || (u.uprops[0xc].intrinsic != 0)) ||
          (u.uprops[0xc].extrinsic != 0)) ||
         ((((youmonst.data)->mflags1 & 0x1000000) != 0 || ((mtmp->data->mflags1 & 0x1000000) != 0)))
         ) || ((mtmp->mux == u.ux && (mtmp->muy == u.uy)))))) {
      bVar8 = false;
      if ((u.uprops[0x2d].extrinsic != 0) && (bVar8 = true, mtmp->mux == u.ux)) {
        bVar8 = mtmp->muy != u.uy;
      }
      local_70 = " at you";
      if (bVar8) {
        local_70 = " at your displaced image";
      }
    }
    else {
      local_70 = " at a spot near you";
    }
    local_68 = local_70;
  }
  else {
    local_68 = "";
  }
  pline("%s casts a spell%s!",local_58,local_68);
LAB_00210b75:
  if (foundyou == '\0') {
    ret = 0;
    if ((mattk->adtyp != 0xf1) && (mattk->adtyp != 0xf0)) {
      pcVar7 = Monnam(mtmp);
      warning("%s casting non-hand-to-hand version of hand-to-hand spell %d?",pcVar7,
              (ulong)mattk->adtyp);
      return 0;
    }
  }
  else if (mattk->damd == '\0') {
    if (0x1d < local_7c) {
      local_7c = 0x1e;
    }
    ret = dice(local_7c / 5 + 1,6);
  }
  else {
    local_78 = local_7c;
    if (0x1d < local_7c) {
      local_78 = 0x1e;
    }
    ret = dice(local_78 / 5 + (uint)mattk->damn,(uint)mattk->damd);
  }
  if ((u.uprops[0x32].intrinsic != 0) || (u.uprops[0x32].extrinsic != 0)) {
    ret = (ret + 1) / 2;
  }
  uVar4 = (uint)mattk->adtyp;
  if (uVar4 == 1) {
    pline("You are hit by a shower of missiles!");
    mana_damageu(ret,mtmp,(char *)0x0,0,'\x01');
    ret = 0;
  }
  else if (uVar4 == 2) {
    pline("You\'re enveloped in flames!");
    fire_damageu(ret,mtmp,(char *)0x0,0,0,'\x01','\x01');
    ret = 0;
  }
  else if (uVar4 == 3) {
    pline("You\'re covered in frost!");
    cold_damageu(ret,mtmp,(char *)0x0,0,0);
    ret = 0;
  }
  else if (uVar4 - 0xf0 < 2) {
    if (mattk->adtyp == 0xf1) {
      cast_wizard_spell(mtmp,ret,local_34);
    }
    else {
      cast_cleric_spell(mtmp,ret,local_34);
    }
    ret = 0;
  }
  if (ret != 0) {
    mdamageu(mtmp,ret);
  }
  return 1;
}

Assistant:

int castmu(struct monst *mtmp,
	   const struct attack *mattk,
	   boolean thinks_it_foundyou,
	   boolean foundyou)
{
	int	dmg, ml = mtmp->m_lev;
	int ret;
	int spellnum = 0;

	/* Three cases:
	 * -- monster is attacking you.  Search for a useful spell.
	 * -- monster thinks it's attacking you.  Search for a useful spell,
	 *    without checking for undirected.  If the spell found is directed,
	 *    it fails with cursetxt() and loss of mspec_used.
	 * -- monster isn't trying to attack.  Select a spell once.  Don't keep
	 *    searching; if that spell is not useful (or if it's directed),
	 *    return and do something else. 
	 * Since most spells are directed, this means that a monster that isn't
	 * attacking casts spells only a small portion of the time that an
	 * attacking monster does.
	 */
	if ((mattk->adtyp == AD_SPEL || mattk->adtyp == AD_CLRC) && ml) {
	    int cnt = 40;

	    do {
		spellnum = rn2(ml);
		if (mattk->adtyp == AD_SPEL)
		    spellnum = choose_magic_spell(spellnum);
		else
		    spellnum = choose_clerical_spell(spellnum);
		/* not trying to attack?  don't allow directed spells */
		if (!thinks_it_foundyou) {
		    if (!is_undirected_spell(mattk->adtyp, spellnum) ||
			spell_would_be_useless(mtmp, mattk->adtyp, spellnum)) {
			if (foundyou)
			    warning("spellcasting monster found you and doesn't know it?");
			return 0;
		    }
		    break;
		}
	    } while (--cnt > 0 &&
		    spell_would_be_useless(mtmp, mattk->adtyp, spellnum));
	    if (cnt == 0) return 0;
	}

	/* monster unable to cast spells? */
	if (mtmp->mcan || mtmp->mspec_used || !ml) {
	    cursetxt(mtmp, is_undirected_spell(mattk->adtyp, spellnum));
	    return 0;
	}

	if (mattk->adtyp == AD_SPEL || mattk->adtyp == AD_CLRC) {
	    mtmp->mspec_used = 10 - mtmp->m_lev;
	    if (mtmp->mspec_used < 2) mtmp->mspec_used = 2;
	    /* your quest leader is a badass and does not need recharge time */
	    if (mtmp->data->msound == MS_LEADER) mtmp->mspec_used = 0;
	}

	/* monster can cast spells, but is casting a directed spell at the
	   wrong place?  If so, give a message, and return.  Do this *after*
	   penalizing mspec_used. */
	if (!foundyou && thinks_it_foundyou &&
		!is_undirected_spell(mattk->adtyp, spellnum)) {
	    pline("%s casts a spell at %s!",
		canseemon(level, mtmp) ? Monnam(mtmp) : "Something",
		level->locations[mtmp->mux][mtmp->muy].typ == WATER
		    ? "empty water" : "thin air");
	    return 0;
	}

	nomul(0, NULL);
	if (rn2(ml*10) < (mtmp->mconf ? 100 : 20)) {	/* fumbled attack */
	    if (canseemon(level, mtmp) && flags.soundok)
		pline("The air crackles around %s.", mon_nam(mtmp));
	    return 0;
	}
	if (canspotmon(level, mtmp) || !is_undirected_spell(mattk->adtyp, spellnum)) {
	    pline("%s casts a spell%s!",
		  canspotmon(level, mtmp) ? Monnam(mtmp) : "Something",
		  is_undirected_spell(mattk->adtyp, spellnum) ? "" :
		  (Invisible && !perceives(mtmp->data) && 
		   (mtmp->mux != u.ux || mtmp->muy != u.uy)) ?
		  " at a spot near you" :
		  (Displaced && (mtmp->mux != u.ux || mtmp->muy != u.uy)) ?
		  " at your displaced image" :
		  " at you");
	}

/*
 *	As these are spells, the damage is related to the level
 *	of the monster casting the spell.
 */
	if (!foundyou) {
	    dmg = 0;
	    if (mattk->adtyp != AD_SPEL && mattk->adtyp != AD_CLRC) {
		warning(
	      "%s casting non-hand-to-hand version of hand-to-hand spell %d?",
			   Monnam(mtmp), mattk->adtyp);
		return 0;
	    }
	} else if (mattk->damd) {
	    dmg = dice(min(ml, 30) / 5 + mattk->damn, mattk->damd);
	} else {
	    dmg = dice(min(ml, 30) / 5 + 1, 6);
	}
	if (Half_spell_damage) dmg = (dmg+1) / 2;

	ret = 1;

	switch (mattk->adtyp) {

	    case AD_FIRE:
		pline("You're enveloped in flames!");
		fire_damageu(dmg, mtmp, NULL, 0, 0, TRUE, TRUE);
		dmg = 0;
		break;
	    case AD_COLD:
		pline("You're covered in frost!");
		cold_damageu(dmg, mtmp, NULL, 0, 0);
		dmg = 0;
		break;
	    case AD_MAGM:
		pline("You are hit by a shower of missiles!");
		mana_damageu(dmg, mtmp, NULL, 0, TRUE);
		dmg = 0;
		break;
	    case AD_SPEL:	/* wizard spell */
	    case AD_CLRC:       /* clerical spell */
	    {
		if (mattk->adtyp == AD_SPEL)
		    cast_wizard_spell(mtmp, dmg, spellnum);
		else
		    cast_cleric_spell(mtmp, dmg, spellnum);
		dmg = 0; /* done by the spell casting functions */
		break;
	    }
	}
	if (dmg) mdamageu(mtmp, dmg);
	return ret;
}